

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

int ipc_ep_bind(void *arg,nng_url *url)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)arg);
  iVar1 = nng_stream_listener_listen(*(nng_stream_listener **)((long)arg + 0x40));
  nni_mtx_unlock((nni_mtx *)arg);
  return iVar1;
}

Assistant:

static int
ipc_ep_bind(void *arg, nng_url *url)
{
	ipc_ep *ep = arg;
	int     rv;
	NNI_ARG_UNUSED(url);

	nni_mtx_lock(&ep->mtx);
	rv = nng_stream_listener_listen(ep->listener);
	nni_mtx_unlock(&ep->mtx);
	return (rv);
}